

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined8 uVar6;
  seq_t sequence;
  U32 i;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  size_t *psVar11;
  BYTE *pBVar12;
  uint uVar13;
  BYTE *pBVar14;
  ulong uVar15;
  BYTE *oend;
  BYTE *__dest;
  ulong uVar16;
  BYTE *pBVar17;
  int iVar18;
  size_t sVar19;
  size_t sVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *litPtr;
  BIT_DStream_t local_110;
  ZSTD_fseState local_e8;
  ZSTD_fseState local_d8;
  ZSTD_fseState local_c8;
  size_t local_b8 [3];
  ZSTD_DCtx *local_a0;
  BYTE *local_98;
  ulong local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ulong local_48;
  size_t sStack_40;
  size_t local_38;
  
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    pBVar12 = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    pBVar12 = dctx->litBuffer;
  }
  local_88 = dctx->litPtr;
  sVar20 = dctx->litSize;
  pBVar17 = local_88 + sVar20;
  pBVar21 = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_007cd1f2:
    uVar15 = (long)pBVar17 - (long)local_88;
    sVar19 = 0xffffffffffffffba;
    if (uVar15 <= (ulong)((long)pBVar12 - (long)pBVar21)) {
      if (pBVar21 == (BYTE *)0x0) {
        pBVar21 = (BYTE *)0x0;
      }
      else {
        memcpy(pBVar21,local_88,uVar15);
        pBVar21 = pBVar21 + uVar15;
      }
      sVar19 = (long)pBVar21 - (long)dst;
    }
  }
  else {
    local_58 = (BYTE *)dctx->prefixStart;
    local_60 = (BYTE *)dctx->virtualStart;
    local_68 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar7 = -0xc;
    do {
      *(ulong *)((long)&local_a0 + lVar7 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar7);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0);
    sVar19 = 0xffffffffffffffec;
    if (seqSize != 0) {
      local_110.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_110.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_110.bitContainer =
               local_110.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_110.bitContainer =
               local_110.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_110.bitContainer =
               local_110.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_110.bitContainer =
               local_110.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_110.bitContainer =
               local_110.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_110.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_110.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 != 0) {
          uVar13 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          local_110.bitsConsumed = (uVar13 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_110.ptr = (char *)seqStart;
LAB_007cc9f0:
          local_110.start = (char *)seqStart;
          local_a0 = dctx;
          local_98 = pBVar12;
          local_80 = local_88 + sVar20;
          local_70 = (BYTE *)dst;
          ZSTD_initFseState(&local_e8,&local_110,dctx->LLTptr);
          ZSTD_initFseState(&local_d8,&local_110,dctx->OFTptr);
          ZSTD_initFseState(&local_c8,&local_110,dctx->MLTptr);
          if (local_70 == (BYTE *)0x0) {
            __assert_fail("dst != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x63e,
                          "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                         );
          }
          local_50 = local_98 + -0x20;
          pBVar21 = local_70;
LAB_007ccaac:
          do {
            pBVar12 = local_58;
            bVar1 = local_e8.table[local_e8.state].nbAdditionalBits;
            if (0x10 < bVar1) {
              __assert_fail("llBits <= MaxLLBits",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x4c8,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            bVar10 = local_c8.table[local_c8.state].nbAdditionalBits;
            if (0x10 < bVar10) {
              __assert_fail("mlBits <= MaxMLBits",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x4c9,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            bVar2 = local_d8.table[local_d8.state].nbAdditionalBits;
            if (0x1f < bVar2) {
              __assert_fail("ofBits <= MaxOff",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x4ca,
                            "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
            }
            local_78 = pBVar21;
            uVar15 = (ulong)local_c8.table[local_c8.state].baseValue;
            uVar13 = local_e8.table[local_e8.state].baseValue;
            uVar16 = (ulong)uVar13;
            local_90 = (ulong)local_d8.table[local_d8.state].nextState;
            bVar3 = local_e8.table[local_e8.state].nbBits;
            bVar4 = local_c8.table[local_c8.state].nbBits;
            bVar5 = local_d8.table[local_d8.state].nbBits;
            bVar9 = (byte)local_110.bitsConsumed;
            if (bVar2 < 2) {
              if (bVar2 != 0) {
                local_110.bitsConsumed = local_110.bitsConsumed + 1;
                lVar7 = (ulong)(local_d8.table[local_d8.state].baseValue + (uint)(uVar13 == 0)) -
                        ((long)(local_110.bitContainer << (bVar9 & 0x3f)) >> 0x3f);
                if (lVar7 == 3) {
                  local_b8[0] = (local_b8[0] - 1) + (ulong)(local_b8[0] == 1);
                }
                else {
                  local_b8[0] = local_b8[lVar7] + (ulong)(local_b8[lVar7] == 0);
                  psVar11 = local_b8;
                  if (lVar7 == 1) goto LAB_007ccba5;
                }
                goto LAB_007ccb61;
              }
              local_b8[0] = local_b8[uVar13 == 0];
              psVar11 = local_b8 + (uVar13 != 0);
            }
            else {
              local_110.bitsConsumed = local_110.bitsConsumed + bVar2;
              local_b8[0] = ((local_110.bitContainer << (bVar9 & 0x3f)) >> (-bVar2 & 0x3f)) +
                            (ulong)local_d8.table[local_d8.state].baseValue;
LAB_007ccb61:
              local_b8[2] = local_b8[1];
              psVar11 = local_b8;
            }
LAB_007ccba5:
            local_b8[1] = *psVar11;
            if (bVar10 != 0) {
              bVar9 = (byte)local_110.bitsConsumed;
              local_110.bitsConsumed = local_110.bitsConsumed + bVar10;
              uVar15 = uVar15 + ((local_110.bitContainer << (bVar9 & 0x3f)) >> (-bVar10 & 0x3f));
            }
            if ((0x1e < (byte)(bVar10 + bVar1 + bVar2)) && (local_110.bitsConsumed < 0x41)) {
              if (local_110.ptr < local_110.limitPtr) {
                if (local_110.ptr == local_110.start) goto LAB_007ccbea;
                uVar8 = (ulong)(uint)((int)local_110.ptr - (int)local_110.start);
                if (local_110.start <=
                    (ulong *)((long)local_110.ptr - (ulong)(local_110.bitsConsumed >> 3))) {
                  uVar8 = (ulong)(local_110.bitsConsumed >> 3);
                }
                local_110.bitsConsumed = local_110.bitsConsumed + (int)uVar8 * -8;
              }
              else {
                uVar8 = (ulong)(local_110.bitsConsumed >> 3);
                local_110.bitsConsumed = local_110.bitsConsumed & 7;
              }
              local_110.ptr = (char *)((long)local_110.ptr - uVar8);
              local_110.bitContainer = *(size_t *)local_110.ptr;
            }
LAB_007ccbea:
            if (bVar1 != 0) {
              bVar10 = (byte)local_110.bitsConsumed;
              local_110.bitsConsumed = local_110.bitsConsumed + bVar1;
              uVar16 = uVar16 + ((local_110.bitContainer << (bVar10 & 0x3f)) >> (-bVar1 & 0x3f));
            }
            if (0x1f < bVar3) {
LAB_007cd26a:
              __assert_fail("nbBits < BIT_MASK_SIZE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                            ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
            }
            local_e8.state =
                 (~(-1L << (bVar3 & 0x3f)) &
                 local_110.bitContainer >> (-(char)(bVar3 + local_110.bitsConsumed) & 0x3fU)) +
                 (ulong)local_e8.table[local_e8.state].nextState;
            if (0x1f < bVar4) goto LAB_007cd26a;
            iVar18 = bVar3 + local_110.bitsConsumed + (uint)bVar4;
            local_c8.state =
                 (~(-1L << (bVar4 & 0x3f)) & local_110.bitContainer >> (-(char)iVar18 & 0x3fU)) +
                 (ulong)local_c8.table[local_c8.state].nextState;
            if (0x1f < bVar5) goto LAB_007cd26a;
            local_110.bitsConsumed = iVar18 + (uint)bVar5;
            local_d8.state =
                 (~(-1L << (bVar5 & 0x3f)) &
                 local_110.bitContainer >> (-(char)local_110.bitsConsumed & 0x3fU)) +
                 (ulong)local_d8.table[local_d8.state].nextState;
            local_48 = uVar16;
            sStack_40 = uVar15;
            local_38 = local_b8[0];
            if (local_80 < local_88 + uVar16) {
LAB_007ccef9:
              sequence.matchLength = uVar15;
              sequence.litLength = uVar16;
              sequence.offset = local_b8[0];
              uVar8 = ZSTD_execSequenceEnd
                                (pBVar21,local_98,sequence,&local_88,local_80,local_58,local_60,
                                 local_68);
            }
            else {
              uVar8 = uVar16 + uVar15;
              pBVar17 = pBVar21 + uVar8;
              if (local_50 < pBVar17) goto LAB_007ccef9;
              if ((long)uVar16 < 0) {
                __assert_fail("op <= oLitEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x3e3,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if ((long)uVar8 <= (long)uVar16) {
                __assert_fail("oLitEnd < oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x3e4,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (local_98 < pBVar17) {
                __assert_fail("oMatchEnd <= oend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x3e5,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              __dest = pBVar21 + uVar16;
              if (local_50 < __dest) {
                __assert_fail("oLitEnd <= oend_w",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,999,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              uVar6 = *(undefined8 *)(local_88 + 8);
              *(undefined8 *)pBVar21 = *(undefined8 *)local_88;
              *(undefined8 *)(pBVar21 + 8) = uVar6;
              sVar20 = local_b8[0];
              if (0x10 < uVar16) {
                if ((BYTE *)0xffffffffffffffe0 < pBVar21 + 0x10 + (-0x10 - (long)(local_88 + 0x10)))
                goto LAB_007cd362;
                uVar6 = *(undefined8 *)(local_88 + 0x18);
                *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(local_88 + 0x10);
                *(undefined8 *)(pBVar21 + 0x18) = uVar6;
                if (0x20 < uVar16) {
                  lVar7 = 0;
                  do {
                    uVar6 = *(undefined8 *)(local_88 + lVar7 + 0x20 + 8);
                    pBVar22 = pBVar21 + lVar7 + 0x20;
                    *(undefined8 *)pBVar22 = *(undefined8 *)(local_88 + lVar7 + 0x20);
                    *(undefined8 *)(pBVar22 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(local_88 + lVar7 + 0x30 + 8);
                    *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_88 + lVar7 + 0x30);
                    *(undefined8 *)(pBVar22 + 0x18) = uVar6;
                    lVar7 = lVar7 + 0x20;
                    sVar20 = local_38;
                  } while (pBVar22 + 0x20 < __dest);
                }
              }
              local_88 = local_88 + uVar16;
              pBVar22 = __dest + -local_b8[0];
              if ((ulong)((long)__dest - (long)local_58) < sVar20) {
                if ((ulong)((long)__dest - (long)local_60) < sVar20) {
                  return 0xffffffffffffffec;
                }
                lVar7 = (long)(__dest + -local_b8[0]) - (long)local_58;
                pBVar21 = local_68 + lVar7;
                local_90 = uVar8;
                if (local_68 < pBVar21 + uVar15) {
                  memmove(__dest,pBVar21,-lVar7);
                  __dest = __dest + -lVar7;
                  uVar15 = uVar15 + lVar7;
                  sStack_40 = uVar15;
                  uVar8 = local_90;
                  pBVar22 = pBVar12;
                  goto LAB_007ccdd8;
                }
                memmove(__dest,pBVar21,uVar15);
                uVar8 = local_90;
                pBVar21 = local_78;
              }
              else {
LAB_007ccdd8:
                sStack_40 = uVar15;
                if (pBVar17 < __dest) {
                  __assert_fail("op <= oMatchEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x408,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (pBVar22 < pBVar12) {
                  __assert_fail("match >= prefixStart",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x40a,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (uVar15 == 0) {
                  __assert_fail("sequence.matchLength >= 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x40b,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                pBVar21 = local_78;
                if (sVar20 < 0x10) {
                  if (__dest < pBVar22) {
                    __assert_fail("*ip <= *op",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                  ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (sVar20 < 8) {
                    iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar20 * 4);
                    *__dest = *pBVar22;
                    __dest[1] = pBVar22[1];
                    __dest[2] = pBVar22[2];
                    __dest[3] = pBVar22[3];
                    pBVar12 = pBVar22 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar20 * 4);
                    pBVar22 = pBVar22 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar20 * 4)
                                        - (long)iVar18);
                    *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar12;
                  }
                  else {
                    *(undefined8 *)__dest = *(undefined8 *)pBVar22;
                  }
                  pBVar12 = pBVar22 + 8;
                  pBVar14 = __dest + 8;
                  if ((long)pBVar14 - (long)pBVar12 < 8) {
                    __assert_fail("*op - *ip >= 8",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                  ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (8 < uVar15) {
                    if (pBVar17 <= pBVar14) {
                      __assert_fail("op < oMatchEnd",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                    ,0x41f,
                                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                   );
                    }
                    if ((ulong)((long)pBVar14 - (long)pBVar12) < 0x10) {
                      do {
                        *(undefined8 *)pBVar14 = *(undefined8 *)pBVar12;
                        pBVar14 = pBVar14 + 8;
                        pBVar12 = pBVar12 + 8;
                      } while (pBVar14 < __dest + uVar15);
                    }
                    else {
                      uVar6 = *(undefined8 *)(pBVar22 + 0x10);
                      *(undefined8 *)pBVar14 = *(undefined8 *)pBVar12;
                      *(undefined8 *)(__dest + 0x10) = uVar6;
                      if (0x18 < (long)uVar15) {
                        lVar7 = 0;
                        do {
                          uVar6 = *(undefined8 *)(pBVar22 + lVar7 + 0x18 + 8);
                          pBVar12 = __dest + lVar7 + 0x18;
                          *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar22 + lVar7 + 0x18);
                          *(undefined8 *)(pBVar12 + 8) = uVar6;
                          uVar6 = *(undefined8 *)(pBVar22 + lVar7 + 0x28 + 8);
                          *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar22 + lVar7 + 0x28);
                          *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                          lVar7 = lVar7 + 0x20;
                        } while (pBVar12 + 0x20 < __dest + uVar15);
                      }
                    }
                  }
                }
                else {
                  if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar22)) {
LAB_007cd362:
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                                  ,0xe9,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar6 = *(undefined8 *)(pBVar22 + 8);
                  *(undefined8 *)__dest = *(undefined8 *)pBVar22;
                  *(undefined8 *)(__dest + 8) = uVar6;
                  if (0x10 < (long)uVar15) {
                    lVar7 = 0x10;
                    do {
                      uVar6 = *(undefined8 *)(pBVar22 + lVar7 + 8);
                      pBVar12 = __dest + lVar7;
                      *(undefined8 *)pBVar12 = *(undefined8 *)(pBVar22 + lVar7);
                      *(undefined8 *)(pBVar12 + 8) = uVar6;
                      uVar6 = *(undefined8 *)(pBVar22 + lVar7 + 0x10 + 8);
                      *(undefined8 *)(pBVar12 + 0x10) = *(undefined8 *)(pBVar22 + lVar7 + 0x10);
                      *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                      lVar7 = lVar7 + 0x20;
                    } while (pBVar12 + 0x20 < __dest + uVar15);
                  }
                }
              }
            }
            if (0xffffffffffffff88 < uVar8) {
              return uVar8;
            }
            pBVar21 = pBVar21 + uVar8;
            nbSeq = nbSeq + -1;
            if (nbSeq == 0) {
              if (local_110.bitsConsumed < 0x41) {
                if (local_110.limitPtr <= local_110.ptr) {
                  return 0xffffffffffffffec;
                }
                if (local_110.bitsConsumed != 0x40) {
                  return 0xffffffffffffffec;
                }
                if (local_110.ptr != local_110.start) {
                  return 0xffffffffffffffec;
                }
              }
              lVar7 = 0;
              do {
                (local_a0->entropy).rep[lVar7] = (U32)local_b8[lVar7];
                lVar7 = lVar7 + 1;
                dst = local_70;
                pBVar12 = local_98;
                pBVar17 = local_80;
              } while (lVar7 != 3);
              goto LAB_007cd1f2;
            }
          } while (0x40 < local_110.bitsConsumed);
          if (local_110.ptr < local_110.limitPtr) {
            if (local_110.ptr == local_110.start) goto LAB_007ccaac;
            uVar13 = (int)local_110.ptr - (int)local_110.start;
            if (local_110.start <=
                (ulong *)((long)local_110.ptr - (ulong)(local_110.bitsConsumed >> 3))) {
              uVar13 = local_110.bitsConsumed >> 3;
            }
            local_110.bitsConsumed = local_110.bitsConsumed + uVar13 * -8;
          }
          else {
            uVar13 = local_110.bitsConsumed >> 3;
            local_110.bitsConsumed = local_110.bitsConsumed & 7;
          }
          local_110.ptr = (char *)((long)local_110.ptr - (ulong)uVar13);
          local_110.bitContainer = *(size_t *)local_110.ptr;
          goto LAB_007ccaac;
        }
      }
      else {
        local_110.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_110.bitContainer = *(size_t *)local_110.ptr;
        if (local_110.bitContainer >> 0x38 != 0) {
          uVar13 = 0x1f;
          bVar1 = (byte)(local_110.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          local_110.bitsConsumed = ~uVar13 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_007cc9f0;
        }
      }
    }
  }
  return sVar19;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset,
                   const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
    return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}